

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O2

void xmlListClear(xmlListPtr l)

{
  _xmlLink *p_Var1;
  xmlLinkPtr pxVar2;
  _xmlLink *lk;
  
  if (l != (xmlListPtr)0x0) {
    pxVar2 = l->sentinel;
    lk = pxVar2->next;
    while (lk != pxVar2) {
      p_Var1 = lk->next;
      xmlLinkDeallocator(l,lk);
      lk = p_Var1;
      pxVar2 = l->sentinel;
    }
  }
  return;
}

Assistant:

void
xmlListClear(xmlListPtr l)
{
    xmlLinkPtr  lk;

    if (l == NULL)
        return;
    lk = l->sentinel->next;
    while(lk != l->sentinel) {
        xmlLinkPtr next = lk->next;

        xmlLinkDeallocator(l, lk);
        lk = next;
    }
}